

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_process_option_cold_6(void)

{
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","lst->to_free",
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tools/options.c",
          0x174);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_append_string_to_free (struct nn_parse_context *ctx,
                                      struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(
        ((char *)ctx->target) + opt->offset);
    nn_assert (lst);
    if (lst->to_free) {
        lst->to_free_num += 1;
        lst->to_free = realloc (lst->items,
                                sizeof (char *) * lst->to_free_num);
    } else {
        lst->to_free = malloc (sizeof (char *));
        lst->to_free_num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }
    nn_assert (lst->to_free);
    lst->to_free [lst->to_free_num - 1] = str;
}